

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

PortReferenceSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PortReferenceSyntax,slang::parsing::Token&,slang::syntax::ElementSelectSyntax*&>
          (BumpAllocator *this,Token *args,ElementSelectSyntax **args_1)

{
  ElementSelectSyntax *pEVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  PortReferenceSyntax *pPVar7;
  
  pPVar7 = (PortReferenceSyntax *)allocate(this,0x28,8);
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar2 = args->info;
  pEVar1 = *args_1;
  (pPVar7->super_PortExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pPVar7->super_PortExpressionSyntax).super_SyntaxNode.kind = PortReference;
  (pPVar7->name).kind = TVar3;
  (pPVar7->name).field_0x2 = uVar4;
  (pPVar7->name).numFlags = (NumericTokenFlags)NVar5.raw;
  (pPVar7->name).rawLen = uVar6;
  (pPVar7->name).info = pIVar2;
  pPVar7->select = pEVar1;
  if (pEVar1 != (ElementSelectSyntax *)0x0) {
    (pEVar1->super_SyntaxNode).parent = (SyntaxNode *)pPVar7;
  }
  return pPVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }